

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

void read_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  int *piVar1;
  uint8_t **ppuVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int *useDefaultScalingMatrixFlag;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int (*scalingList) [16];
  int iVar13;
  int iVar14;
  uint uVar15;
  int *piVar16;
  int (*paiVar17) [16];
  uint32_t r;
  int (*paiVar18) [16];
  bool bVar19;
  
  uVar8 = 0;
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  piVar1 = &b->bits_left;
  uVar5 = b->bits_left;
  if ((uVar5 == 8) && (pbVar4 = b->p, pbVar4 < b->end)) {
    uVar8 = (uint)*pbVar4;
    b->p = pbVar4 + 1;
  }
  else {
    pbVar4 = b->p;
    iVar6 = 7;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      uVar12 = 0;
      if (pbVar4 < b->end) {
        uVar12 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 | uVar12 << ((byte)iVar6 & 0x1f);
      bVar19 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar19);
  }
  sps->profile_idc = uVar8;
  uVar12 = b->bits_left - 1;
  b->bits_left = uVar12;
  pbVar4 = b->p;
  pbVar3 = b->end;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  ppuVar2 = &b->p;
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set0_flag = uVar5;
  uVar12 = *piVar1 - 1;
  *piVar1 = uVar12;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set1_flag = uVar5;
  uVar12 = *piVar1 - 1;
  *piVar1 = uVar12;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set2_flag = uVar5;
  uVar12 = *piVar1 - 1;
  *piVar1 = uVar12;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set3_flag = uVar5;
  uVar12 = *piVar1 - 1;
  *piVar1 = uVar12;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set4_flag = uVar5;
  uVar12 = *piVar1 - 1;
  *piVar1 = uVar12;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
  }
  if (uVar12 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->constraint_set5_flag = uVar5;
  uVar5 = *piVar1;
  iVar6 = 2;
  do {
    uVar5 = uVar5 - 1;
    if (uVar5 == 0) {
      *ppuVar2 = *ppuVar2 + 1;
      uVar5 = 8;
    }
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  *piVar1 = uVar5;
  if ((uVar5 == 8) && (pbVar4 = *ppuVar2, pbVar4 < pbVar3)) {
    uVar12 = (uint)*pbVar4;
    *ppuVar2 = pbVar4 + 1;
  }
  else {
    pbVar4 = *ppuVar2;
    uVar12 = 0;
    iVar6 = 7;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      uVar9 = 0;
      if (pbVar4 < pbVar3) {
        uVar9 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar12 = uVar12 | uVar9 << ((byte)iVar6 & 0x1f);
      bVar19 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar19);
  }
  sps->level_idc = uVar12;
  uVar5 = *piVar1;
  pbVar4 = *ppuVar2;
  uVar12 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar12 = uVar12 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar19 & uVar12 < 0x20)) && (pbVar4 < pbVar3));
  if (iVar6 == -1) {
    uVar5 = 0;
  }
  else {
    iVar7 = -2 - iVar6;
    iVar13 = -3 - iVar6;
    uVar12 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    do {
      uVar12 = uVar12 - 1;
      *piVar1 = uVar12;
      uVar9 = 0;
      if (pbVar4 < pbVar3) {
        uVar9 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
      }
      if (uVar12 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar12 = 8;
      }
      uVar5 = uVar5 | uVar9 << ((byte)iVar7 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar13 != -2);
  }
  sps->seq_parameter_set_id = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
  if ((((uVar8 - 0x53 < 0x39) && ((0x188208808020009U >> ((ulong)(uVar8 - 0x53) & 0x3f) & 1) != 0))
      || (uVar8 == 0xf4)) || (uVar8 == 0x2c)) {
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    if (iVar6 == -1) {
      uVar5 = 0;
    }
    else {
      iVar7 = -2 - iVar6;
      iVar13 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar7 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar13 != -2);
    }
    uVar8 = 0xffffffff;
    iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
    sps->chroma_format_idc = iVar6;
    if (iVar6 == 3) {
      uVar12 = *piVar1 - 1;
      *piVar1 = uVar12;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      if (pbVar4 < pbVar3) {
        uVar5 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
      }
      if (uVar12 == 0) {
        *ppuVar2 = pbVar4 + 1;
        *piVar1 = 8;
      }
      sps->residual_colour_transform_flag = uVar5;
    }
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    iVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar7 = 0;
    uVar5 = 0;
    if (iVar6 != -1) {
      iVar13 = -2 - iVar6;
      iVar14 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar8 = 0xffffffff;
    sps->bit_depth_luma_minus8 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    uVar8 = 0;
    uVar5 = 0;
    if (iVar7 != -1) {
      iVar6 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar12 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar12 = uVar12 - 1;
        *piVar1 = uVar12;
        uVar9 = 0;
        if (pbVar4 < pbVar3) {
          uVar9 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
        }
        if (uVar12 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar12 = 8;
        }
        uVar5 = uVar5 | uVar9 << ((byte)iVar6 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar13 != -2);
    }
    sps->bit_depth_chroma_minus8 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar5;
    uVar5 = *piVar1 - 1;
    *piVar1 = uVar5;
    pbVar4 = *ppuVar2;
    if (pbVar4 < pbVar3) {
      uVar8 = (uint)((*pbVar4 >> (uVar5 & 0x1f) & 1) != 0);
    }
    if (uVar5 == 0) {
      *ppuVar2 = pbVar4 + 1;
      *piVar1 = 8;
    }
    sps->qpprime_y_zero_transform_bypass_flag = uVar8;
    uVar8 = *piVar1 - 1;
    *piVar1 = uVar8;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    if (pbVar4 < pbVar3) {
      uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      *ppuVar2 = pbVar4 + 1;
      *piVar1 = 8;
    }
    sps->seq_scaling_matrix_present_flag = uVar5;
    if (uVar5 != 0) {
      paiVar18 = sps->ScalingList4x4;
      piVar16 = sps->ScalingList8x8[5] + 0x3a;
      paiVar17 = (int (*) [16])(sps[-1].offset_for_ref_frame + 0xfd);
      uVar11 = 0;
      do {
        uVar8 = b->bits_left - 1;
        b->bits_left = uVar8;
        pbVar4 = b->p;
        uVar5 = 0;
        if (pbVar4 < b->end) {
          uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          *ppuVar2 = pbVar4 + 1;
          *piVar1 = 8;
        }
        piVar16[-0x1ec] = uVar5;
        if (uVar5 != 0) {
          if (uVar11 < 6) {
            iVar6 = 0x10;
            useDefaultScalingMatrixFlag = piVar16 + -0x180;
            scalingList = paiVar18;
          }
          else {
            iVar6 = 0x40;
            useDefaultScalingMatrixFlag = piVar16;
            scalingList = paiVar17;
          }
          read_scaling_list(b,*scalingList,iVar6,useDefaultScalingMatrixFlag);
        }
        uVar11 = uVar11 + 1;
        piVar16 = piVar16 + 1;
        paiVar18 = paiVar18 + 1;
        paiVar17 = paiVar17 + 4;
      } while (uVar11 < (ulong)(sps->chroma_format_idc == 3) * 4 + 8);
    }
  }
  pbVar4 = b->p;
  pbVar3 = b->end;
  uVar5 = b->bits_left;
  uVar8 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
  iVar7 = 0;
  uVar5 = 0;
  if (iVar6 != -1) {
    iVar13 = -2 - iVar6;
    iVar14 = -3 - iVar6;
    uVar8 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    do {
      uVar8 = uVar8 - 1;
      *piVar1 = uVar8;
      uVar12 = 0;
      if (pbVar4 < pbVar3) {
        uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar8 = 8;
      }
      uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar13 = iVar13 + -1;
    } while (iVar14 != -2);
  }
  uVar8 = 0xffffffff;
  sps->log2_max_frame_num_minus4 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
  uVar5 = *piVar1;
  pbVar4 = *ppuVar2;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
  if (iVar7 == -1) {
    uVar5 = 0;
  }
  else {
    iVar6 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar8 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    do {
      uVar8 = uVar8 - 1;
      *piVar1 = uVar8;
      uVar12 = 0;
      if (pbVar4 < pbVar3) {
        uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar8 = 8;
      }
      uVar5 = uVar5 | uVar12 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  iVar6 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar5;
  sps->pic_order_cnt_type = iVar6;
  if (iVar6 == 1) {
    uVar8 = *piVar1 - 1;
    *piVar1 = uVar8;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    if (pbVar4 < pbVar3) {
      uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      *ppuVar2 = pbVar4 + 1;
      *piVar1 = 8;
    }
    sps->delta_pic_order_always_zero_flag = uVar5;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar7 = 0;
    uVar5 = 0;
    if (iVar6 != -1) {
      iVar13 = -2 - iVar6;
      iVar14 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar12 = -1 << (~(byte)iVar6 & 0x1f);
    uVar8 = ~uVar12 + uVar5;
    iVar6 = -((int)uVar8 >> 1);
    if ((uVar8 & 1) != 0) {
      iVar6 = (int)(uVar5 - uVar12) >> 1;
    }
    uVar8 = 0xffffffff;
    sps->offset_for_non_ref_pic = iVar6;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar6 = 0;
    uVar5 = 0;
    if (iVar7 != -1) {
      iVar13 = -2 - iVar7;
      iVar14 = -3 - iVar7;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar12 = -1 << (~(byte)iVar7 & 0x1f);
    uVar8 = ~uVar12 + uVar5;
    iVar7 = -((int)uVar8 >> 1);
    if ((uVar8 & 1) != 0) {
      iVar7 = (int)(uVar5 - uVar12) >> 1;
    }
    uVar8 = 0xffffffff;
    sps->offset_for_top_to_bottom_field = iVar7;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    if (iVar6 == -1) {
      uVar5 = 0;
    }
    else {
      iVar7 = -2 - iVar6;
      iVar13 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar7 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar13 != -2);
    }
    uVar8 = ~(-1 << (~(byte)iVar6 & 0x1f));
    uVar12 = uVar8 + uVar5;
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar12;
    if (uVar12 != 0 && SCARRY4(uVar8,uVar5) == (int)uVar12 < 0) {
      pbVar4 = *ppuVar2;
      uVar11 = 0;
      do {
        uVar5 = *piVar1;
        uVar8 = 0xffffffff;
        iVar6 = -2;
        do {
          iVar7 = iVar6;
          uVar9 = uVar8;
          uVar5 = uVar5 - 1;
          *piVar1 = uVar5;
          bVar19 = true;
          if (pbVar4 < pbVar3) {
            bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
          }
          if (uVar5 == 0) {
            pbVar4 = pbVar4 + 1;
            *ppuVar2 = pbVar4;
            *piVar1 = 8;
            uVar5 = 8;
          }
          uVar8 = uVar9 + 1;
        } while (((bool)(bVar19 & uVar8 < 0x20)) && (iVar6 = iVar7 + 1, pbVar4 < pbVar3));
        if (uVar8 == 0) {
          uVar5 = 0;
        }
        else {
          uVar15 = *piVar1;
          uVar5 = 0;
          do {
            uVar15 = uVar15 - 1;
            *piVar1 = uVar15;
            uVar10 = 0;
            if (pbVar4 < pbVar3) {
              uVar10 = (uint)((*pbVar4 >> (uVar15 & 0x1f) & 1) != 0);
            }
            if (uVar15 == 0) {
              pbVar4 = pbVar4 + 1;
              *ppuVar2 = pbVar4;
              *piVar1 = 8;
              uVar15 = 8;
            }
            uVar5 = uVar5 | uVar10 << ((byte)uVar9 & 0x1f);
            uVar9 = uVar9 - 1;
            iVar7 = iVar7 + -1;
          } while (iVar7 != -2);
        }
        uVar9 = -1 << ((byte)uVar8 & 0x1f);
        uVar8 = ~uVar9 + uVar5;
        iVar6 = -((int)uVar8 >> 1);
        if ((uVar8 & 1) != 0) {
          iVar6 = (int)(uVar5 - uVar9) >> 1;
        }
        sps->offset_for_ref_frame[uVar11] = iVar6;
        uVar11 = uVar11 + 1;
      } while (uVar11 != uVar12);
    }
  }
  else if (iVar6 == 0) {
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    if (iVar6 == -1) {
      uVar5 = 0;
    }
    else {
      iVar7 = -2 - iVar6;
      iVar13 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar7 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar7 = iVar7 + -1;
      } while (iVar13 != -2);
    }
    sps->log2_max_pic_order_cnt_lsb_minus4 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
  }
  uVar5 = *piVar1;
  pbVar4 = *ppuVar2;
  uVar8 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
  uVar5 = 0;
  uVar8 = 0;
  if (iVar6 != -1) {
    iVar7 = -2 - iVar6;
    iVar13 = -3 - iVar6;
    uVar12 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0;
    do {
      uVar12 = uVar12 - 1;
      *piVar1 = uVar12;
      uVar9 = 0;
      if (pbVar4 < pbVar3) {
        uVar9 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
      }
      if (uVar12 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar12 = 8;
      }
      uVar8 = uVar8 | uVar9 << ((byte)iVar7 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar13 != -2);
  }
  sps->num_ref_frames = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar8;
  uVar8 = *piVar1 - 1;
  *piVar1 = uVar8;
  pbVar4 = *ppuVar2;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
  }
  if (uVar8 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->gaps_in_frame_num_value_allowed_flag = uVar5;
  uVar5 = *piVar1;
  pbVar4 = *ppuVar2;
  uVar8 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
  iVar7 = 0;
  uVar5 = 0;
  if (iVar6 != -1) {
    iVar13 = -2 - iVar6;
    iVar14 = -3 - iVar6;
    uVar8 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    do {
      uVar8 = uVar8 - 1;
      *piVar1 = uVar8;
      uVar12 = 0;
      if (pbVar4 < pbVar3) {
        uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
      }
      if (uVar8 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar8 = 8;
      }
      uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar13 = iVar13 + -1;
    } while (iVar14 != -2);
  }
  uVar8 = 0xffffffff;
  sps->pic_width_in_mbs_minus1 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
  uVar5 = *piVar1;
  pbVar4 = *ppuVar2;
  do {
    uVar5 = uVar5 - 1;
    *piVar1 = uVar5;
    bVar19 = true;
    if (pbVar4 < pbVar3) {
      bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
    }
    if (uVar5 == 0) {
      pbVar4 = pbVar4 + 1;
      *ppuVar2 = pbVar4;
      *piVar1 = 8;
      uVar5 = 8;
    }
    uVar8 = uVar8 + 1;
    iVar7 = iVar7 + -1;
  } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
  uVar5 = 0;
  uVar8 = 0;
  if (iVar7 != -1) {
    iVar6 = -2 - iVar7;
    iVar13 = -3 - iVar7;
    uVar12 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0;
    do {
      uVar12 = uVar12 - 1;
      *piVar1 = uVar12;
      uVar9 = 0;
      if (pbVar4 < pbVar3) {
        uVar9 = (uint)((*pbVar4 >> (uVar12 & 0x1f) & 1) != 0);
      }
      if (uVar12 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar12 = 8;
      }
      uVar8 = uVar8 | uVar9 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  sps->pic_height_in_map_units_minus1 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar8;
  uVar8 = b->bits_left - 1;
  b->bits_left = uVar8;
  pbVar4 = b->p;
  pbVar3 = b->end;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
  }
  if (uVar8 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->frame_mbs_only_flag = uVar5;
  if (uVar5 == 0) {
    uVar8 = *piVar1 - 1;
    *piVar1 = uVar8;
    pbVar4 = *ppuVar2;
    uVar5 = 0;
    if (pbVar4 < pbVar3) {
      uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
    }
    if (uVar8 == 0) {
      *ppuVar2 = pbVar4 + 1;
      *piVar1 = 8;
    }
    sps->mb_adaptive_frame_field_flag = uVar5;
  }
  uVar8 = *piVar1 - 1;
  *piVar1 = uVar8;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
  }
  if (uVar8 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->direct_8x8_inference_flag = uVar5;
  uVar8 = *piVar1 - 1;
  *piVar1 = uVar8;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
  }
  if (uVar8 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->frame_cropping_flag = uVar5;
  if (uVar5 != 0) {
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    uVar8 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar7 = 0;
    uVar5 = 0;
    if (iVar6 != -1) {
      iVar13 = -2 - iVar6;
      iVar14 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar8 = 0xffffffff;
    sps->frame_crop_left_offset = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar6 = 0;
    uVar5 = 0;
    if (iVar7 != -1) {
      iVar13 = -2 - iVar7;
      iVar14 = -3 - iVar7;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar8 = 0xffffffff;
    sps->frame_crop_right_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar5;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    iVar7 = 0;
    uVar5 = 0;
    if (iVar6 != -1) {
      iVar13 = -2 - iVar6;
      iVar14 = -3 - iVar6;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar13 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar13 = iVar13 + -1;
      } while (iVar14 != -2);
    }
    uVar8 = 0xffffffff;
    sps->frame_crop_top_offset = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar5;
    uVar5 = *piVar1;
    pbVar4 = *ppuVar2;
    do {
      uVar5 = uVar5 - 1;
      *piVar1 = uVar5;
      bVar19 = true;
      if (pbVar4 < pbVar3) {
        bVar19 = (*pbVar4 >> (uVar5 & 0x1f) & 1) == 0;
      }
      if (uVar5 == 0) {
        pbVar4 = pbVar4 + 1;
        *ppuVar2 = pbVar4;
        *piVar1 = 8;
        uVar5 = 8;
      }
      uVar8 = uVar8 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar19 & uVar8 < 0x20)) && (pbVar4 < pbVar3));
    if (iVar7 == -1) {
      uVar5 = 0;
    }
    else {
      iVar6 = -2 - iVar7;
      iVar13 = -3 - iVar7;
      uVar8 = *piVar1;
      pbVar4 = *ppuVar2;
      uVar5 = 0;
      do {
        uVar8 = uVar8 - 1;
        *piVar1 = uVar8;
        uVar12 = 0;
        if (pbVar4 < pbVar3) {
          uVar12 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
        }
        if (uVar8 == 0) {
          pbVar4 = pbVar4 + 1;
          *ppuVar2 = pbVar4;
          *piVar1 = 8;
          uVar8 = 8;
        }
        uVar5 = uVar5 | uVar12 << ((byte)iVar6 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar13 != -2);
    }
    sps->frame_crop_bottom_offset = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar5;
  }
  uVar8 = *piVar1 - 1;
  *piVar1 = uVar8;
  pbVar4 = *ppuVar2;
  uVar5 = 0;
  if (pbVar4 < pbVar3) {
    uVar5 = (uint)((*pbVar4 >> (uVar8 & 0x1f) & 1) != 0);
  }
  if (uVar8 == 0) {
    *ppuVar2 = pbVar4 + 1;
    *piVar1 = 8;
  }
  sps->vui_parameters_present_flag = uVar5;
  if (uVar5 == 0) {
    return;
  }
  read_vui_parameters(sps,b);
  return;
}

Assistant:

void read_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    sps->profile_idc = bs_read_u8(b);
    sps->constraint_set0_flag = bs_read_u1(b);
    sps->constraint_set1_flag = bs_read_u1(b);
    sps->constraint_set2_flag = bs_read_u1(b);
    sps->constraint_set3_flag = bs_read_u1(b);
    sps->constraint_set4_flag = bs_read_u1(b);
    sps->constraint_set5_flag = bs_read_u1(b);
    /* reserved_zero_2bits */ bs_skip_u(b, 2);
    sps->level_idc = bs_read_u8(b);
    sps->seq_parameter_set_id = bs_read_ue(b);

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        sps->chroma_format_idc = bs_read_ue(b);
        if( sps->chroma_format_idc == 3 )
        {
            sps->residual_colour_transform_flag = bs_read_u1(b);
        }
        sps->bit_depth_luma_minus8 = bs_read_ue(b);
        sps->bit_depth_chroma_minus8 = bs_read_ue(b);
        sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b);
        sps->seq_scaling_matrix_present_flag = bs_read_u1(b);
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < ((sps->chroma_format_idc != 3) ? 8 : 12); i++ )
            {
                sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    sps->log2_max_frame_num_minus4 = bs_read_ue(b);
    sps->pic_order_cnt_type = bs_read_ue(b);
    if( sps->pic_order_cnt_type == 0 )
    {
        sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        sps->delta_pic_order_always_zero_flag = bs_read_u1(b);
        sps->offset_for_non_ref_pic = bs_read_se(b);
        sps->offset_for_top_to_bottom_field = bs_read_se(b);
        sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b);
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            sps->offset_for_ref_frame[ i ] = bs_read_se(b);
        }
    }
    sps->num_ref_frames = bs_read_ue(b);
    sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b);
    sps->pic_width_in_mbs_minus1 = bs_read_ue(b);
    sps->pic_height_in_map_units_minus1 = bs_read_ue(b);
    sps->frame_mbs_only_flag = bs_read_u1(b);
    if( !sps->frame_mbs_only_flag )
    {
        sps->mb_adaptive_frame_field_flag = bs_read_u1(b);
    }
    sps->direct_8x8_inference_flag = bs_read_u1(b);
    sps->frame_cropping_flag = bs_read_u1(b);
    if( sps->frame_cropping_flag )
    {
        sps->frame_crop_left_offset = bs_read_ue(b);
        sps->frame_crop_right_offset = bs_read_ue(b);
        sps->frame_crop_top_offset = bs_read_ue(b);
        sps->frame_crop_bottom_offset = bs_read_ue(b);
    }
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if( sps->vui_parameters_present_flag )
    {
        read_vui_parameters(sps, b);
    }
}